

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  Allocator *pAVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  int *piVar8;
  void *pvVar9;
  size_t sVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 extraout_var [12];
  Mat anchors;
  void *local_98;
  int *piStack_90;
  size_t local_88;
  Allocator *local_80;
  undefined8 local_78;
  int iStack_70;
  undefined4 uStack_6c;
  size_t local_68;
  void *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar5 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar5;
  iVar5 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar5;
  iVar5 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar5;
  iVar5 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar5;
  fVar12 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar12;
  iVar5 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar5;
  iVar5 = this->base_size;
  uVar2 = (this->ratios).w;
  uVar3 = (this->scales).w;
  iStack_70 = uVar3 * uVar2;
  local_98 = (void *)0x0;
  piStack_90 = (int *)0x0;
  local_88 = 4;
  local_80 = (Allocator *)0x0;
  local_78 = 0x400000002;
  uStack_6c = 1;
  sVar10 = (size_t)(iStack_70 * 4);
  local_68 = sVar10;
  if (iStack_70 != 0) {
    pvVar6 = malloc(sVar10 * 4 + 0x1c);
    local_98 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_98 + -8) = pvVar6;
    piStack_90 = (int *)(sVar10 * 4 + (long)local_98);
    *piStack_90 = 1;
  }
  piVar8 = piStack_90;
  if (0 < (int)uVar2) {
    local_58 = (float)iVar5 * 0.5;
    local_60 = (this->ratios).data;
    pvVar6 = (this->scales).data;
    uVar11 = 0;
    pvVar9 = local_98;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)uVar3) {
        fVar12 = *(float *)((long)local_60 + uVar11 * 4);
        auVar15 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar12));
        fVar13 = auVar15._0_4_;
        fVar13 = roundf(fVar13 * -0.5 * (float)iVar5 * (fVar12 * fVar13 * fVar13 + -3.0));
        local_48 = (float)(int)fVar13;
        fStack_44 = (float)(int)extraout_var._0_4_;
        fStack_40 = (float)(int)extraout_var._4_4_;
        fStack_3c = (float)(int)extraout_var._8_4_;
        fVar12 = roundf(fVar12 * local_48);
        lVar7 = 0;
        do {
          fVar13 = *(float *)((long)pvVar6 + lVar7) * 0.5;
          fVar14 = fVar13 * local_48;
          fVar13 = fVar13 * (float)(int)fVar12;
          pfVar1 = (float *)((long)pvVar9 + lVar7 * 4);
          *pfVar1 = local_58 - fVar14;
          pfVar1[1] = fStack_54 - fVar13;
          pfVar1[2] = fVar14 + fStack_50;
          pfVar1[3] = fVar13 + fStack_4c;
          lVar7 = lVar7 + 4;
        } while ((ulong)uVar3 * 4 - lVar7 != 0);
      }
      uVar11 = uVar11 + 1;
      pvVar9 = (void *)((long)pvVar9 + (ulong)uVar3 * 0x10);
    } while (uVar11 != uVar2);
  }
  if (&this->anchors != (Mat *)&local_98) {
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    piVar8 = (this->anchors).refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        pvVar6 = (this->anchors).data;
        pAVar4 = (this->anchors).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar6 != (void *)0x0) {
            free(*(void **)((long)pvVar6 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 8))();
        }
      }
    }
    (this->anchors).data = local_98;
    (this->anchors).refcount = piStack_90;
    (this->anchors).elemsize = local_88;
    (this->anchors).allocator = local_80;
    (this->anchors).dims = (undefined4)local_78;
    (this->anchors).w = local_78._4_4_;
    (this->anchors).h = iStack_70;
    (this->anchors).c = uStack_6c;
    (this->anchors).cstep = local_68;
    piVar8 = piStack_90;
  }
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_80 == (Allocator *)0x0) {
        if (local_98 != (void *)0x0) {
          free(*(void **)((long)local_98 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_80 + 8))();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}